

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O1

void cbtPolyhedralContactClipping::clipFaceAgainstHull
               (cbtVector3 *separatingNormal,cbtConvexPolyhedron *hullA,cbtTransform *transA,
               cbtVertexArray *worldVertsB1,cbtVertexArray *worldVertsB2,cbtScalar minDist,
               cbtScalar maxDist,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  float fVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  float fVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  int iVar15;
  int iVar16;
  cbtFace *pcVar17;
  int *piVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  bool bVar23;
  Result *pRVar24;
  cbtVertexArray *pcVar25;
  cbtVector3 *pcVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  cbtScalar *pcVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [64];
  cbtVector3 point;
  cbtVector3 local_78;
  Result *local_60;
  cbtScalar local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_58 = minDist;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  if ((worldVertsB2->m_size < 0) && (worldVertsB2->m_capacity < 0)) {
    if (worldVertsB2->m_data != (cbtVector3 *)0x0) {
      if (worldVertsB2->m_ownsMemory == true) {
        cbtAlignedFreeInternal(worldVertsB2->m_data);
      }
      worldVertsB2->m_data = (cbtVector3 *)0x0;
    }
    worldVertsB2->m_ownsMemory = true;
    worldVertsB2->m_data = (cbtVector3 *)0x0;
    worldVertsB2->m_capacity = 0;
  }
  worldVertsB2->m_size = 0;
  iVar15 = worldVertsB1->m_size;
  local_60 = resultOut;
  if (worldVertsB2->m_capacity < iVar15) {
    if (iVar15 == 0) {
      pcVar26 = (cbtVector3 *)0x0;
    }
    else {
      pcVar26 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar15 << 4,0x10);
    }
    iVar16 = worldVertsB2->m_size;
    if (0 < (long)iVar16) {
      lVar29 = 0;
      do {
        puVar1 = (undefined8 *)((long)worldVertsB2->m_data->m_floats + lVar29);
        uVar22 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar26->m_floats + lVar29);
        *puVar2 = *puVar1;
        puVar2[1] = uVar22;
        lVar29 = lVar29 + 0x10;
      } while ((long)iVar16 * 0x10 != lVar29);
    }
    if (worldVertsB2->m_data != (cbtVector3 *)0x0) {
      if (worldVertsB2->m_ownsMemory == true) {
        cbtAlignedFreeInternal(worldVertsB2->m_data);
      }
      worldVertsB2->m_data = (cbtVector3 *)0x0;
    }
    worldVertsB2->m_ownsMemory = true;
    worldVertsB2->m_data = pcVar26;
    worldVertsB2->m_capacity = iVar15;
  }
  uVar27 = (ulong)(hullA->m_faces).m_size;
  if ((long)uVar27 < 1) {
    uVar31 = 0xffffffff;
  }
  else {
    pcVar30 = ((hullA->m_faces).m_data)->m_plane + 2;
    auVar45 = ZEXT464(0x7f7fffff);
    uVar32 = 0xffffffff;
    uVar33 = 0;
    do {
      cVar3 = pcVar30[-2];
      fVar44 = pcVar30[-1];
      cVar4 = *pcVar30;
      auVar34 = vmulss_avx512f(ZEXT416((uint)fVar44),
                               ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[1]));
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar35 = vmulss_avx512f(ZEXT416((uint)fVar44),
                               ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[1]));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]),
                                    ZEXT416((uint)cVar3));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]),
                                    ZEXT416((uint)cVar4));
      auVar35 = vmulss_avx512f(auVar35,ZEXT416((uint)separatingNormal->m_floats[1]));
      auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)separatingNormal->m_floats[0]),auVar34);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]),
                                ZEXT416((uint)cVar3));
      auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]),
                                ZEXT416((uint)cVar4));
      auVar35 = vfmadd213ss_avx512f(auVar34,ZEXT416((uint)separatingNormal->m_floats[2]),auVar35);
      fVar44 = auVar45._0_4_;
      auVar34 = vminss_avx(auVar35,auVar45._0_16_);
      auVar45 = ZEXT1664(auVar34);
      if (auVar35._0_4_ < fVar44) {
        uVar32 = uVar33 & 0xffffffff;
      }
      uVar31 = (uint)uVar32;
      uVar33 = uVar33 + 1;
      pcVar30 = pcVar30 + 0xc;
    } while (uVar27 != uVar33);
  }
  if (-1 < (int)uVar31) {
    pcVar17 = (hullA->m_faces).m_data;
    uVar27 = (ulong)pcVar17[uVar31].m_indices.m_size;
    if (0 < (long)uVar27) {
      uVar32 = 0;
      pcVar25 = worldVertsB1;
      do {
        worldVertsB1 = worldVertsB2;
        worldVertsB2 = pcVar25;
        piVar18 = pcVar17[uVar31].m_indices.m_data;
        iVar15 = piVar18[uVar32];
        pcVar26 = (hullA->m_vertices).m_data;
        uVar32 = uVar32 + 1;
        uVar33 = 0;
        if (uVar32 != uVar27) {
          uVar33 = uVar32 & 0xffffffff;
        }
        iVar16 = piVar18[uVar33];
        fVar44 = pcVar26[iVar15].m_floats[1];
        fVar19 = pcVar26[iVar15].m_floats[0] - pcVar26[iVar16].m_floats[0];
        fVar20 = fVar44 - pcVar26[iVar16].m_floats[1];
        fVar21 = pcVar26[iVar15].m_floats[2] - pcVar26[iVar16].m_floats[2];
        cVar3 = (transA->m_basis).m_el[0].m_floats[0];
        fVar5 = (transA->m_basis).m_el[0].m_floats[1];
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar5)),ZEXT416((uint)cVar3),
                                  ZEXT416((uint)fVar19));
        cVar4 = (transA->m_basis).m_el[0].m_floats[2];
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar4),ZEXT416((uint)fVar21));
        cVar6 = (transA->m_basis).m_el[1].m_floats[0];
        fVar7 = (transA->m_basis).m_el[1].m_floats[1];
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar20)),ZEXT416((uint)cVar6),
                                  ZEXT416((uint)fVar19));
        cVar8 = (transA->m_basis).m_el[1].m_floats[2];
        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)cVar8),ZEXT416((uint)fVar21));
        cVar9 = (transA->m_basis).m_el[2].m_floats[0];
        fVar10 = (transA->m_basis).m_el[2].m_floats[1];
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar20)),ZEXT416((uint)cVar9),
                                  ZEXT416((uint)fVar19));
        cVar11 = (transA->m_basis).m_el[2].m_floats[2];
        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar11),ZEXT416((uint)fVar21));
        cVar12 = pcVar17[uVar31].m_plane[0];
        cVar13 = pcVar17[uVar31].m_plane[1];
        cVar14 = pcVar17[uVar31].m_plane[2];
        auVar36 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)cVar13));
        auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar3),ZEXT416((uint)cVar12));
        auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar4),ZEXT416((uint)cVar14));
        auVar37 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)cVar13));
        auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)cVar6),ZEXT416((uint)cVar12));
        auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)cVar8),ZEXT416((uint)cVar14));
        auVar38 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)cVar13));
        auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)cVar9),ZEXT416((uint)cVar12));
        auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)cVar11),ZEXT416((uint)cVar14));
        auVar39 = vmulss_avx512f(auVar37,auVar40);
        auVar39 = vfmsub231ss_avx512f(auVar39,auVar35,auVar38);
        auVar38 = vmulss_avx512f(auVar38,auVar34);
        auVar38 = vfmsub231ss_avx512f(auVar38,auVar36,auVar40);
        auVar35 = vmulss_avx512f(auVar36,auVar35);
        auVar36 = vfmsub231ss_avx512f(auVar35,auVar34,auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar35 = vxorps_avx512vl(auVar36,auVar37);
        auVar34 = vinsertps_avx512f(auVar39,auVar38,0x1c);
        auVar34 = vxorps_avx512vl(auVar34,auVar37);
        local_78.m_floats = (cbtScalar  [4])vinsertps_avx(auVar34,auVar35,0x28);
        auVar40 = ZEXT416((uint)pcVar26[iVar15].m_floats[0]);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar5)),auVar40,ZEXT416((uint)cVar3));
        auVar41 = ZEXT416((uint)pcVar26[iVar15].m_floats[2]);
        auVar34 = vfmadd231ss_fma(auVar34,auVar41,ZEXT416((uint)cVar4));
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar44)),auVar40,ZEXT416((uint)cVar6));
        auVar35 = vfmadd231ss_fma(auVar35,auVar41,ZEXT416((uint)cVar8));
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar44)),auVar40,ZEXT416((uint)cVar9));
        auVar40 = vfmadd231ss_fma(auVar40,auVar41,ZEXT416((uint)cVar11));
        auVar35 = vmulss_avx512f(ZEXT416((uint)(auVar35._0_4_ + (transA->m_origin).m_floats[1])),
                                 auVar38);
        auVar34 = vfnmsub231ss_fma(auVar35,auVar39,
                                   ZEXT416((uint)(auVar34._0_4_ + (transA->m_origin).m_floats[0])));
        auVar34 = vfnmadd231ss_fma(auVar34,auVar36,
                                   ZEXT416((uint)(auVar40._0_4_ + (transA->m_origin).m_floats[2])));
        auVar34 = vxorps_avx512vl(auVar34,auVar37);
        clipFace(worldVertsB2,worldVertsB1,&local_78,auVar34._0_4_);
        iVar15 = worldVertsB2->m_size;
        lVar29 = (long)iVar15;
        if ((lVar29 < 1) && (iVar15 < 0)) {
          if (worldVertsB2->m_capacity < 0) {
            if (worldVertsB2->m_data != (cbtVector3 *)0x0) {
              if (worldVertsB2->m_ownsMemory == true) {
                cbtAlignedFreeInternal(worldVertsB2->m_data);
              }
              worldVertsB2->m_data = (cbtVector3 *)0x0;
            }
            worldVertsB2->m_ownsMemory = true;
            worldVertsB2->m_data = (cbtVector3 *)0x0;
            worldVertsB2->m_capacity = 0;
          }
          if (iVar15 < 0) {
            lVar28 = lVar29 << 4;
            do {
              puVar1 = (undefined8 *)((long)worldVertsB2->m_data->m_floats + lVar28);
              *puVar1 = local_40;
              puVar1[1] = uStack_38;
              lVar28 = lVar28 + 0x10;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0);
          }
        }
        worldVertsB2->m_size = 0;
        pcVar25 = worldVertsB1;
      } while (uVar32 != uVar27);
    }
    pRVar24 = local_60;
    if (0 < worldVertsB1->m_size) {
      cVar3 = pcVar17[uVar31].m_plane[0];
      fVar44 = pcVar17[uVar31].m_plane[1];
      cVar4 = pcVar17[uVar31].m_plane[2];
      fVar5 = pcVar17[uVar31].m_plane[3];
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
      auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
      auVar45 = ZEXT1664(auVar34);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[1].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
      auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
      auVar42 = ZEXT1664(auVar35);
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar3),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar4),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
      auVar43 = ZEXT1664(auVar40);
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * (transA->m_origin).m_floats[1])),
                                auVar34,ZEXT416((uint)(transA->m_origin).m_floats[0]));
      auVar36 = vfmadd231ss_fma(auVar36,auVar40,ZEXT416((uint)(transA->m_origin).m_floats[2]));
      lVar28 = 0;
      lVar29 = 0;
      do {
        pcVar26 = worldVertsB1->m_data;
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar42._0_4_ *
                                                *(float *)((long)pcVar26->m_floats + lVar28 + 4))),
                                  auVar45._0_16_,
                                  ZEXT416(*(uint *)((long)pcVar26->m_floats + lVar28)));
        auVar37 = vfmadd231ss_fma(auVar37,auVar43._0_16_,
                                  ZEXT416(*(uint *)((long)pcVar26->m_floats + lVar28 + 8)));
        fVar44 = (fVar5 - auVar36._0_4_) + auVar37._0_4_;
        auVar37._4_4_ = uStack_54;
        auVar37._0_4_ = local_58;
        auVar37._8_4_ = uStack_50;
        auVar37._12_4_ = uStack_4c;
        uVar22 = vcmpss_avx512f(ZEXT416((uint)fVar44),auVar37,2);
        bVar23 = (bool)((byte)uVar22 & 1);
        if ((float)((uint)bVar23 * (int)local_58 + (uint)!bVar23 * (int)fVar44) <= maxDist) {
          local_78.m_floats = *(cbtScalar (*) [4])((long)pcVar26->m_floats + lVar28);
          (*pRVar24->_vptr_Result[4])(pRVar24,separatingNormal,&local_78);
          auVar43 = ZEXT464(auVar40._0_4_);
          auVar42 = ZEXT464((uint)auVar35._0_4_);
          auVar45 = ZEXT464(auVar34._0_4_);
        }
        lVar29 = lVar29 + 1;
        lVar28 = lVar28 + 0x10;
      } while (lVar29 < worldVertsB1->m_size);
    }
  }
  return;
}

Assistant:

void cbtPolyhedralContactClipping::clipFaceAgainstHull(const cbtVector3& separatingNormal, const cbtConvexPolyhedron& hullA, const cbtTransform& transA, cbtVertexArray& worldVertsB1, cbtVertexArray& worldVertsB2, const cbtScalar minDist, cbtScalar maxDist, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	worldVertsB2.resize(0);
	cbtVertexArray* pVtxIn = &worldVertsB1;
	cbtVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA = -1;
	{
		cbtScalar dmin = FLT_MAX;
		for (int face = 0; face < hullA.m_faces.size(); face++)
		{
			const cbtVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const cbtVector3 faceANormalWS = transA.getBasis() * Normal;

			cbtScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA < 0)
		return;

	const cbtFace& polyA = hullA.m_faces[closestFaceA];

	// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for (int e0 = 0; e0 < numVerticesA; e0++)
	{
		const cbtVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const cbtVector3& b = hullA.m_vertices[polyA.m_indices[(e0 + 1) % numVerticesA]];
		const cbtVector3 edge0 = a - b;
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		cbtVector3 worldPlaneAnormal1 = transA.getBasis() * cbtVector3(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);

		cbtVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);  //.cross(WorldEdge0);
		cbtVector3 worldA1 = transA * a;
		cbtScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);

//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		cbtVector3 localPlaneNormal(hullA.m_faces[otherFace].m_plane[0], hullA.m_faces[otherFace].m_plane[1], hullA.m_faces[otherFace].m_plane[2]);
		cbtScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
#else
		cbtVector3 planeNormalWS = planeNormalWS1;
		cbtScalar planeEqWS = planeEqWS1;

#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut, planeNormalWS, planeEqWS);
		cbtSwap(pVtxIn, pVtxOut);
		pVtxOut->resize(0);
	}

	//#define ONLY_REPORT_DEEPEST_POINT

	cbtVector3 point;

	// only keep points that are behind the witness face
	{
		cbtVector3 localPlaneNormal(polyA.m_plane[0], polyA.m_plane[1], polyA.m_plane[2]);
		cbtScalar localPlaneEq = polyA.m_plane[3];
		cbtVector3 planeNormalWS = transA.getBasis() * localPlaneNormal;
		cbtScalar planeEqWS = localPlaneEq - planeNormalWS.dot(transA.getOrigin());
		for (int i = 0; i < pVtxIn->size(); i++)
		{
			cbtVector3 vtx = pVtxIn->at(i);
			cbtScalar depth = planeNormalWS.dot(vtx) + planeEqWS;
			if (depth <= minDist)
			{
				//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <= maxDist)
			{
				cbtVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in cbtPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				}
#endif
				resultOut.addContactPoint(separatingNormal, point, depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist < maxDist)
	{
		resultOut.addContactPoint(separatingNormal, point, curMaxDist);
	}
#endif  //ONLY_REPORT_DEEPEST_POINT
}